

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
writeValueAttribute(UA_Server *server,UA_VariableNode *node,UA_DataValue *value,
                   UA_String *indexRange)

{
  _func_UA_StatusCode_void_ptr_UA_NodeId_UA_Variant_ptr_UA_NumericRange_ptr *p_Var1;
  _func_void_void_ptr_UA_NodeId_UA_Variant_ptr_UA_NumericRange_ptr *p_Var2;
  UA_StatusCode UVar3;
  long lVar4;
  UA_DataValue *pUVar5;
  anon_union_120_2_91199e5c_for_value *paVar6;
  undefined8 *puVar7;
  UA_NumericRangeDimension **ppUVar8;
  anon_union_120_2_91199e5c_for_value *dst;
  UA_VariableNode *writtenNode;
  byte bVar9;
  undefined1 auStack_108 [8];
  timeval tv;
  undefined1 local_a8 [8];
  UA_NumericRange range;
  UA_DataValue editableValue;
  
  bVar9 = 0;
  if ((indexRange == (UA_String *)0x0) || (indexRange->length == 0)) {
    editableValue.serverPicoseconds = 0;
    editableValue._90_6_ = 0;
  }
  else {
    editableValue._88_8_ = local_a8;
    UVar3 = parse_numericrange(indexRange,(UA_NumericRange *)editableValue._88_8_);
    if (UVar3 != 0) {
      return UVar3;
    }
  }
  pUVar5 = value;
  ppUVar8 = &range.dimensions;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    *ppUVar8 = *(UA_NumericRangeDimension **)pUVar5;
    pUVar5 = (UA_DataValue *)((long)pUVar5 + (ulong)bVar9 * -0x10 + 8);
    ppUVar8 = ppUVar8 + (ulong)bVar9 * -2 + 1;
  }
  pUVar5 = &editableValue;
  editableValue.value.type._0_4_ = 1;
  if (((undefined1  [96])((undefined1  [96])*value & (undefined1  [96])0x1) == (undefined1  [96])0x0
      ) || (UVar3 = typeCheckValue(server,&node->dataType,node->valueRank,node->arrayDimensionsSize,
                                   node->arrayDimensions,&value->value,
                                   (UA_NumericRange *)editableValue._88_8_,(UA_Variant *)pUVar5),
           UVar3 == 0)) {
    if (((byte)range.dimensions & 4) == 0) {
      gettimeofday((timeval *)auStack_108,(__timezone_ptr_t)0x0);
      editableValue._56_8_ = (long)auStack_108 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
      range.dimensions._0_1_ = (byte)range.dimensions | 4;
    }
    if (node->valueSource == UA_VALUESOURCE_DATA) {
      if (editableValue._88_8_ == 0) {
        dst = &node->value;
        paVar6 = dst;
        puVar7 = (undefined8 *)auStack_108;
        for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar7 = (paVar6->dataSource).handle;
          paVar6 = (anon_union_120_2_91199e5c_for_value *)((long)paVar6 + (ulong)bVar9 * -0x10 + 8);
          puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        }
        UVar3 = UA_copy(&range.dimensions,dst,UA_TYPES + 0x16);
        if (UVar3 == 0) {
          deleteMembers_noInit(auStack_108,UA_TYPES + 0x16);
        }
        else {
          puVar7 = (undefined8 *)auStack_108;
          for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
            (dst->dataSource).handle = (void *)*puVar7;
            puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
            dst = (anon_union_120_2_91199e5c_for_value *)((long)dst + (ulong)bVar9 * -0x10 + 8);
          }
        }
      }
      else {
        UVar3 = 0x80360000;
        if ((((int)editableValue.value.arrayDimensions != *(int *)((long)&node->value + 0x38)) ||
            (((byte)range.dimensions & 1) == 0)) ||
           ((undefined1  [120])((undefined1  [120])node->value & (undefined1  [120])0x1) ==
            (undefined1  [120])0x0)) goto LAB_0011ee2a;
        if ((editableValue.value._8_8_ == 0) && (1 < editableValue.value.arrayLength)) {
          pUVar5 = (UA_DataValue *)auStack_108;
          tv.tv_usec = editableValue.value._8_8_;
          auStack_108 = (undefined1  [8])editableValue._0_8_;
          tv.tv_sec = CONCAT44(editableValue.value.type._4_4_,editableValue.value.type._0_4_);
          editableValue.value._8_8_ = 1;
        }
        UVar3 = Variant_setRange(&(node->value).data.value.value,(void *)(pUVar5->value).arrayLength
                                 ,editableValue.value._8_8_,*(UA_NumericRange *)editableValue._88_8_
                                 ,true);
        if (UVar3 == 0) {
          bVar9 = *(byte *)&node->value;
          *(int *)((long)&node->value + 0x38) = (int)editableValue.value.arrayDimensions;
          *(undefined8 *)((long)&node->value + 0x40) = editableValue._56_8_;
          *(byte *)&node->value = (byte)range.dimensions & 0x16 | bVar9 & 0xe9;
          *(undefined2 *)((long)&node->value + 0x48) = (undefined2)editableValue.sourceTimestamp;
        }
      }
      if (UVar3 == 0) {
        p_Var2 = (node->value).data.callback.onWrite;
        UVar3 = 0;
        if (p_Var2 != (_func_void_void_ptr_UA_NodeId_UA_Variant_ptr_UA_NumericRange_ptr *)0x0) {
          (*p_Var2)((node->value).data.callback.handle,node->nodeId,&(node->value).data.value.value,
                    (UA_NumericRange *)editableValue._88_8_);
        }
      }
    }
    else {
      p_Var1 = (node->value).dataSource.write;
      if (p_Var1 == (_func_UA_StatusCode_void_ptr_UA_NodeId_UA_Variant_ptr_UA_NumericRange_ptr *)0x0
         ) {
        UVar3 = 0x80730000;
      }
      else {
        UVar3 = (*p_Var1)((node->value).dataSource.handle,node->nodeId,(UA_Variant *)pUVar5,
                          (UA_NumericRange *)editableValue._88_8_);
      }
    }
  }
  if (editableValue._88_8_ == 0) {
    return UVar3;
  }
LAB_0011ee2a:
  free((void *)range.dimensionsSize);
  return UVar3;
}

Assistant:

UA_StatusCode
writeValueAttribute(UA_Server *server, UA_VariableNode *node,
                    const UA_DataValue *value, const UA_String *indexRange) {
    /* Parse the range */
    UA_NumericRange range;
    UA_NumericRange *rangeptr = NULL;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(indexRange && indexRange->length > 0) {
        retval = parse_numericrange(indexRange, &range);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        rangeptr = &range;
    }

    /* Copy the value into an editable "container" where e.g. the datatype can
     * be adjusted. The data itself is not written into. */
    UA_DataValue editableValue = *value;
    editableValue.value.storageType = UA_VARIANT_DATA_NODELETE;

    /* Type checking. May change the type of editableValue */
    if(value->hasValue) {
        retval = typeCheckValue(server, &node->dataType, node->valueRank,
                                node->arrayDimensionsSize, node->arrayDimensions,
                                &value->value, rangeptr, &editableValue.value);
        if(retval != UA_STATUSCODE_GOOD)
            goto cleanup;
    }

    /* Set the source timestamp if there is none */
    if(!editableValue.hasSourceTimestamp) {
        editableValue.sourceTimestamp = UA_DateTime_now();
        editableValue.hasSourceTimestamp = true;
    }

    /* Ok, do it */
    if(node->valueSource == UA_VALUESOURCE_DATA) {
        if(!rangeptr)
            retval = writeValueAttributeWithoutRange(node, &editableValue);
        else
            retval = writeValueAttributeWithRange(node, &editableValue, rangeptr);

        /* Callback after writing */
        if(retval == UA_STATUSCODE_GOOD && node->value.data.callback.onWrite) {
            const UA_VariableNode *writtenNode;
#ifdef UA_ENABLE_MULTITHREADING
            /* Reopen the node to see the changes (multithreading only) */
            writtenNode = (const UA_VariableNode*)UA_NodeStore_get(server->nodestore, &node->nodeId);
#else
            writtenNode = node; /* The node is written in-situ (TODO: this might
                                   change with the nodestore plugin approach) */
#endif
            UA_RCU_UNLOCK();
            writtenNode->value.data.callback.onWrite(writtenNode->value.data.callback.handle,
                                                     writtenNode->nodeId,
                                                     &writtenNode->value.data.value.value, rangeptr);
            UA_RCU_LOCK();
        }
    } else {
        if(node->value.dataSource.write) {
            UA_RCU_UNLOCK();
            retval = node->value.dataSource.write(node->value.dataSource.handle,
                                                  node->nodeId, &editableValue.value, rangeptr);
            UA_RCU_LOCK();
        } else {
            retval = UA_STATUSCODE_BADWRITENOTSUPPORTED;
        }
    }

    /* Clean up */
 cleanup:
    if(rangeptr)
        UA_free(range.dimensions);
    return retval;
}